

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O0

void __thiscall
csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
Dijkstra(Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
        EnvironmentPtr *env_ptr,double time_limit)

{
  double time_limit_local;
  EnvironmentPtr *env_ptr_local;
  Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this_local;
  
  this->_vptr_Dijkstra = (_func_int **)&PTR_run_0012ace8;
  std::shared_ptr<sliding_puzzle::SlidingPuzzle>::shared_ptr(&this->env_ptr_,env_ptr);
  Params::Params(&this->params_);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::shared_ptr
            (&this->start_vertex_);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::shared_ptr
            (&this->goal_vertex_);
  csbpl_common::Heap<double>::Heap(&this->open_);
  std::
  unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
  ::unordered_map(&this->closed_);
  std::
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ::vector(&this->path_);
  PlannerStats<sliding_puzzle::SlidingPuzzleState>::PlannerStats(&this->planner_stats_);
  (this->params_).time_limit_ = time_limit;
  return;
}

Assistant:

Dijkstra(EnvironmentPtr& env_ptr,
             double time_limit) : env_ptr_(env_ptr)
    {
      params_.time_limit_ = time_limit;
    }